

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoostTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::BoostApprovalListener::test_unit_start(BoostApprovalListener *this,test_unit *test)

{
  string *file;
  TestName *this_00;
  read_access_t __x;
  long in_RSI;
  function<void_()> *in_RDI;
  string path;
  allocator<char> *in_stack_ffffffffffffff68;
  TestPassedNotification *in_stack_ffffffffffffff90;
  allocator<char> local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  file = (string *)
         boost::unit_test::basic_cstring<const_char>::begin
                   ((basic_cstring<const_char> *)(in_RSI + 0x18));
  this_00 = (TestName *)
            boost::unit_test::basic_cstring<const_char>::end
                      ((basic_cstring<const_char> *)(local_10 + 0x18));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<char_const*,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)file,(char *)in_RDI,in_stack_ffffffffffffff68);
  ::std::allocator<char>::~allocator(&local_31);
  TestName::setFileName(this_00,file);
  __x = boost::unit_test::class_property::operator_cast_to_string_
                  ((class_property *)(local_10 + 0x88));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI,__x);
  FrameworkIntegrations::setCurrentTest((TestName *)0x198411);
  ::std::function<void()>::
  function<ApprovalTests::BoostApprovalListener::test_unit_start(boost::unit_test::test_unit_const&)::_lambda()_1_,void>
            (in_RDI,(anon_class_1_0_00000001 *)__x);
  FrameworkIntegrations::setTestPassedNotification(in_stack_ffffffffffffff90);
  ::std::function<void_()>::~function((function<void_()> *)0x19843b);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void test_unit_start(boost::unit_test::test_unit const& test) override
        {
            std::string path(test.p_file_name.begin(), test.p_file_name.end());
            currentTest.setFileName(path);

            currentTest.sections.push_back(test.p_name);
            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { BOOST_CHECK(true); });
        }